

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_1aacf::Indent::~Indent(Indent *this)

{
  std::__cxx11::string::_M_assign((string *)this->m_indent);
  std::__cxx11::string::~string((string *)&this->m_save);
  return;
}

Assistant:

~Indent() { m_indent = m_save; }